

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

void __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::insert<char>
          (BlockPatternMatchVector *this,int64_t block,char key,int pos)

{
  uint64_t uVar1;
  MapElem *pMVar2;
  uint64_t *puVar3;
  BitvectorHashmap *this_00;
  
  if (key < '\0') {
    this_00 = (this->m_map).
              super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
              ._M_impl.super__Vector_impl_data._M_start + block;
    uVar1 = BitvectorHashmap::lookup(this_00,(long)key);
    pMVar2 = (this_00->m_map)._M_elems + uVar1;
    puVar3 = &pMVar2->value;
    pMVar2->key = (long)key;
  }
  else {
    puVar3 = (this->m_extendedAscii).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + (ulong)(byte)key * this->m_block_count + block;
  }
  *puVar3 = *puVar3 | 1L << ((byte)pos & 0x3f);
  return;
}

Assistant:

void insert(int64_t block, CharT key, int pos)
    {
        uint64_t mask = 1ull << pos;

        assert(block < m_block_count);
        if (key >= 0 && key <= 255) {
            m_extendedAscii[static_cast<size_t>(key * m_block_count + block)] |= mask;
        }
        else {
            m_map[static_cast<size_t>(block)].insert_mask(key, mask);
        }
    }